

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O3

QVersionNumber from_string(QLatin1StringView string,qsizetype *suffixIndex)

{
  qsizetype *pqVar1;
  long *in_RCX;
  long lVar2;
  qsizetype *begin;
  qsizetype *pqVar3;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar4;
  int local_d4;
  QVLABase<int> local_d0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  anon_union_8_3_e50c5c22_for_SegmentStorage_0 local_38;
  
  local_38 = *(anon_union_8_3_e50c5c22_for_SegmentStorage_0 *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d0.super_QVLABaseBase.a = 0x20;
  local_d0.super_QVLABaseBase.s = 0;
  pqVar3 = suffixIndex;
  begin = suffixIndex;
  local_d0.super_QVLABaseBase.ptr = &local_b8;
  while( true ) {
    QVar4 = qstrntoull((char *)begin,(long)(string.m_data + (long)suffixIndex) - (long)begin,10);
    lVar2 = QVar4.used;
    if ((lVar2 < 1) || (0x7fffffff < QVar4.result)) break;
    local_d4 = (int)QVar4.result;
    QVLABase<int>::emplace_back_impl<int>(&local_d0,0x20,&local_b8,&local_d4);
    pqVar1 = (qsizetype *)((long)begin + lVar2 + 1);
    pqVar3 = (qsizetype *)((long)begin + lVar2);
    if ((string.m_data + (long)suffixIndex <= pqVar1) || (begin = pqVar1, (char)*pqVar3 != '.'))
    break;
  }
  if (in_RCX != (long *)0x0) {
    *in_RCX = (long)pqVar3 - (long)suffixIndex;
  }
  QVersionNumber::SegmentStorage::SegmentStorage
            ((SegmentStorage *)string.m_size,(int *)local_d0.super_QVLABaseBase.ptr,
             (int *)((long)local_d0.super_QVLABaseBase.ptr + local_d0.super_QVLABaseBase.s * 4));
  if ((undefined1 **)local_d0.super_QVLABaseBase.ptr != &local_b8) {
    QtPrivate::sizedFree(local_d0.super_QVLABaseBase.ptr,local_d0.super_QVLABaseBase.a << 2);
  }
  if (((anon_union_8_3_e50c5c22_for_SegmentStorage_0 *)(in_FS_OFFSET + 0x28))->dummy !=
      local_38.dummy) {
    __stack_chk_fail();
  }
  return (QVersionNumber)
         ((anon_union_8_3_e50c5c22_for_SegmentStorage_0 *)(in_FS_OFFSET + 0x28))->dummy;
}

Assistant:

static QVersionNumber from_string(QLatin1StringView string, qsizetype *suffixIndex)
{
    // 32 should be more than enough, and, crucially, it means we're allocating
    // not more (and often less) often when compared with direct QList usage
    // for all possible segment counts (under the constraint that we don't want
    // to keep more capacity around for the lifetime of the resulting
    // QVersionNumber than required), esp. in the common case where the inline
    // storage can be used.
    QVarLengthArray<int, 32> seg;

    const char *start = string.begin();
    const char *lastGoodEnd = start;
    const char *endOfString = string.end();

    do {
        // parsing as unsigned so a minus sign is rejected
        auto [value, used] = qstrntoull(start, endOfString - start, 10);
        if (used <= 0 || value > qulonglong(std::numeric_limits<int>::max()))
            break;
        seg.append(int(value));
        start += used + 1;
        lastGoodEnd = start - 1;
    } while (start < endOfString && *lastGoodEnd == '.');

    if (suffixIndex)
        *suffixIndex = lastGoodEnd - string.begin();

    return QVersionNumber(seg);
}